

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsSecondDerivByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,double *outSumLogLikelihoodByPartition,
          double *outSumFirstDerivativeByPartition,double *outSumSecondDerivativeByPartition)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  long in_stack_00000008;
  int i_3;
  int k_3;
  double *scalingFactors;
  long in_stack_00000020;
  int i_2;
  double sumOverID2;
  double sumOverID1;
  double sumOverI;
  long in_stack_00000040;
  int k_2;
  int u;
  int j;
  double sumOverJD2;
  double sumOverJD1;
  double sumOverJ;
  int i_1;
  int w_1;
  int k_1;
  double weight_1;
  int u_2;
  int l_1;
  int v_1;
  double *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  double weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  double *freqs;
  double *wt;
  double *secondDerivMatrix;
  double *firstDerivMatrix;
  double *transMatrix;
  double *partialsParent;
  int scalingFactorsIndex;
  int stateFrequenciesIndex;
  int categoryWeightsIndex;
  int secondDerivativeIndex;
  int firstDerivativeIndex;
  int probIndex;
  int childIndex;
  int parIndex;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b4;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < sumOverID2._0_4_; local_34 = local_34 + 1) {
    iVar2 = *(int *)(in_stack_00000020 + (long)local_34 * 4);
    local_148 = *(int *)(*(long *)(in_RDI + 0x90) + (long)iVar2 * 4);
    iVar2 = *(int *)(*(long *)(in_RDI + 0x90) + (long)(iVar2 + 1) * 4);
    memset((void *)(*(long *)(in_RDI + 0xe0) + (long)(local_148 * *(int *)(in_RDI + 0x24)) * 8),0,
           (long)((iVar2 - local_148) * *(int *)(in_RDI + 0x24)) << 3);
    memset((void *)(*(long *)(in_RDI + 0xe8) + (long)(local_148 * *(int *)(in_RDI + 0x24)) * 8),0,
           (long)((iVar2 - local_148) * *(int *)(in_RDI + 0x24)) << 3);
    memset((void *)(*(long *)(in_RDI + 0xf0) + (long)(local_148 * *(int *)(in_RDI + 0x24)) * 8),0,
           (long)((iVar2 - local_148) * *(int *)(in_RDI + 0x24)) << 3);
    iVar3 = *(int *)(in_RDX + (long)local_34 * 4);
    iVar4 = *(int *)((long)scalingFactors + (long)local_34 * 4);
    lVar5 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)*(int *)(in_RSI + (long)local_34 * 4) * 8);
    lVar6 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)*(int *)(in_RCX + (long)local_34 * 4) * 8);
    lVar7 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)*(int *)(in_R8 + (long)local_34 * 4) * 8);
    lVar8 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)*(int *)(in_R9 + (long)local_34 * 4) * 8);
    lVar9 = *(long *)(*(long *)(in_RDI + 0xa0) +
                     (long)*(int *)(in_stack_00000008 + (long)local_34 * 4) * 8);
    lVar10 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(_i_3 + (long)local_34 * 4) * 8);
    if ((iVar3 < *(int *)(in_RDI + 0x10)) &&
       (*(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 8) != 0)) {
      lVar11 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 8);
      local_9c = local_148 * *(int *)(in_RDI + 0x2c);
      for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0x34); local_a0 = local_a0 + 1) {
        local_a4 = local_148 * *(int *)(in_RDI + 0x24);
        uVar1 = *(ulong *)(lVar9 + (long)local_a0 * 8);
        for (local_b4 = local_148; local_b4 < iVar2; local_b4 = local_b4 + 1) {
          iVar3 = *(int *)(lVar11 + (long)local_b4 * 4);
          local_bc = local_a0 * *(int *)(in_RDI + 0x40);
          for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x24); local_c0 = local_c0 + 1) {
            auVar13._8_8_ = 0;
            auVar13._0_8_ = uVar1;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8);
            auVar29._8_8_ = 0;
            auVar29._0_8_ =
                 *(double *)(lVar6 + (long)(local_bc + iVar3) * 8) *
                 *(double *)(lVar5 + (long)(local_9c + local_c0) * 8);
            auVar16 = vfmadd213sd_fma(auVar13,auVar29,auVar45);
            *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8) = auVar16._0_8_;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = uVar1;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_a4 * 8);
            auVar30._8_8_ = 0;
            auVar30._0_8_ =
                 *(double *)(lVar7 + (long)(local_bc + iVar3) * 8) *
                 *(double *)(lVar5 + (long)(local_9c + local_c0) * 8);
            auVar16 = vfmadd213sd_fma(auVar14,auVar30,auVar46);
            *(long *)(*(long *)(in_RDI + 0xe8) + (long)local_a4 * 8) = auVar16._0_8_;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = uVar1;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xf0) + (long)local_a4 * 8);
            auVar31._8_8_ = 0;
            auVar31._0_8_ =
                 *(double *)(lVar8 + (long)(local_bc + iVar3) * 8) *
                 *(double *)(lVar5 + (long)(local_9c + local_c0) * 8);
            auVar16 = vfmadd213sd_fma(auVar15,auVar31,auVar47);
            *(long *)(*(long *)(in_RDI + 0xf0) + (long)local_a4 * 8) = auVar16._0_8_;
            local_a4 = local_a4 + 1;
            local_bc = *(int *)(in_RDI + 0x28) + local_bc;
          }
          local_9c = *(int *)(in_RDI + 0x2c) + local_9c;
        }
        local_9c = ((*(int *)(in_RDI + 0x14) - iVar2) + local_148) * *(int *)(in_RDI + 0x2c) +
                   local_9c;
      }
    }
    else {
      lVar11 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar3 * 8);
      local_cc = local_148 * *(int *)(in_RDI + 0x2c);
      for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0x34); local_d0 = local_d0 + 1) {
        local_d4 = local_148 * *(int *)(in_RDI + 0x24);
        uVar1 = *(ulong *)(lVar9 + (long)local_d0 * 8);
        for (local_e4 = local_148; local_e4 < iVar2; local_e4 = local_e4 + 1) {
          local_e8 = local_d0 * *(int *)(in_RDI + 0x40);
          for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x24); local_ec = local_ec + 1) {
            local_f8 = 0.0;
            local_100 = 0.0;
            local_108 = 0.0;
            for (local_10c = 0; local_10c < *(int *)(in_RDI + 0x24); local_10c = local_10c + 1) {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)(lVar6 + (long)local_e8 * 8);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = *(ulong *)(lVar11 + (long)(local_cc + local_10c) * 8);
              auVar48._8_8_ = 0;
              auVar48._0_8_ = local_f8;
              auVar16 = vfmadd213sd_fma(auVar16,auVar32,auVar48);
              local_f8 = auVar16._0_8_;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *(ulong *)(lVar7 + (long)local_e8 * 8);
              auVar17._8_8_ = 0;
              auVar17._0_8_ = *(ulong *)(lVar11 + (long)(local_cc + local_10c) * 8);
              auVar49._8_8_ = 0;
              auVar49._0_8_ = local_100;
              auVar16 = vfmadd213sd_fma(auVar17,auVar33,auVar49);
              local_100 = auVar16._0_8_;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *(ulong *)(lVar8 + (long)local_e8 * 8);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = *(ulong *)(lVar11 + (long)(local_cc + local_10c) * 8);
              auVar50._8_8_ = 0;
              auVar50._0_8_ = local_108;
              auVar16 = vfmadd213sd_fma(auVar18,auVar34,auVar50);
              local_108 = auVar16._0_8_;
              local_e8 = local_e8 + 1;
            }
            local_e8 = local_e8 + 1;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = uVar1;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_d4 * 8);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = local_f8 * *(double *)(lVar5 + (long)(local_cc + local_ec) * 8);
            auVar16 = vfmadd213sd_fma(auVar19,auVar35,auVar51);
            *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_d4 * 8) = auVar16._0_8_;
            auVar20._8_8_ = 0;
            auVar20._0_8_ = uVar1;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_d4 * 8);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = local_100 * *(double *)(lVar5 + (long)(local_cc + local_ec) * 8);
            auVar16 = vfmadd213sd_fma(auVar20,auVar36,auVar52);
            *(long *)(*(long *)(in_RDI + 0xe8) + (long)local_d4 * 8) = auVar16._0_8_;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = uVar1;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xf0) + (long)local_d4 * 8);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = local_108 * *(double *)(lVar5 + (long)(local_cc + local_ec) * 8);
            auVar16 = vfmadd213sd_fma(auVar21,auVar37,auVar53);
            *(long *)(*(long *)(in_RDI + 0xf0) + (long)local_d4 * 8) = auVar16._0_8_;
            local_d4 = local_d4 + 1;
          }
          local_cc = *(int *)(in_RDI + 0x2c) + local_cc;
        }
        local_cc = ((*(int *)(in_RDI + 0x14) - iVar2) + local_148) * *(int *)(in_RDI + 0x2c) +
                   local_cc;
      }
    }
    local_110 = local_148 * *(int *)(in_RDI + 0x24);
    for (local_114 = local_148; local_114 < iVar2; local_114 = local_114 + 1) {
      local_120 = 0.0;
      local_128 = 0.0;
      local_130 = 0.0;
      for (local_134 = 0; local_134 < *(int *)(in_RDI + 0x24); local_134 = local_134 + 1) {
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(lVar10 + (long)local_134 * 8);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_110 * 8);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_120;
        auVar16 = vfmadd213sd_fma(auVar22,auVar38,auVar54);
        local_120 = auVar16._0_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(lVar10 + (long)local_134 * 8);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_110 * 8);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = local_128;
        auVar16 = vfmadd213sd_fma(auVar23,auVar39,auVar55);
        local_128 = auVar16._0_8_;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(lVar10 + (long)local_134 * 8);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xf0) + (long)local_110 * 8);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = local_130;
        auVar16 = vfmadd213sd_fma(auVar24,auVar40,auVar56);
        local_130 = auVar16._0_8_;
        local_110 = local_110 + 1;
      }
      dVar12 = log(local_120);
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_114 * 8) = dVar12;
      *(double *)(*(long *)(in_RDI + 0x118) + (long)local_114 * 8) = local_128 / local_120;
      auVar57._0_8_ = local_130 / local_120;
      auVar57._8_8_ = 0;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x118) + (long)local_114 * 8);
      auVar41._8_8_ = 0;
      auVar41._0_8_ =
           *(ulong *)(*(long *)(in_RDI + 0x118) + (long)local_114 * 8) ^ 0x8000000000000000;
      auVar16 = vfmadd213sd_fma(auVar25,auVar41,auVar57);
      *(long *)(*(long *)(in_RDI + 0x120) + (long)local_114 * 8) = auVar16._0_8_;
    }
    if (iVar4 != -1) {
      lVar5 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)iVar4 * 8);
      for (local_144 = local_148; local_144 < iVar2; local_144 = local_144 + 1) {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_144 * 8) =
             *(double *)(lVar5 + (long)local_144 * 8) +
             *(double *)(*(long *)(in_RDI + 0x110) + (long)local_144 * 8);
      }
    }
    *(undefined8 *)((long)sumOverID1 + (long)local_34 * 8) = 0;
    *(undefined8 *)((long)sumOverI + (long)local_34 * 8) = 0;
    *(undefined8 *)(in_stack_00000040 + (long)local_34 * 8) = 0;
    for (; local_148 < iVar2; local_148 = local_148 + 1) {
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_148 * 8);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_148 * 8);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(ulong *)((long)sumOverID1 + (long)local_34 * 8);
      auVar16 = vfmadd213sd_fma(auVar26,auVar42,auVar58);
      *(long *)((long)sumOverID1 + (long)local_34 * 8) = auVar16._0_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x118) + (long)local_148 * 8);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_148 * 8);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(ulong *)((long)sumOverI + (long)local_34 * 8);
      auVar16 = vfmadd213sd_fma(auVar27,auVar43,auVar59);
      *(long *)((long)sumOverI + (long)local_34 * 8) = auVar16._0_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x120) + (long)local_148 * 8);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_148 * 8);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)(in_stack_00000040 + (long)local_34 * 8);
      auVar16 = vfmadd213sd_fma(auVar28,auVar44,auVar60);
      *(long *)(in_stack_00000040 + (long)local_34 * 8) = auVar16._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* firstDerivativeIndices,
                                                  const int* secondDerivativeIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition,
                                                  double* outSumFirstDerivativeByPartition,
                                                  double* outSumSecondDerivativeByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&firstDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&secondDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int firstDerivativeIndex = firstDerivativeIndices[p];
        const int secondDerivativeIndex = secondDerivativeIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
        const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child

            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJ = 0.0;
                        double sumOverJD1 = 0.0;
                        double sumOverJD2 = 0.0;
                        for(int j = 0; j < kStateCount; j++) {
                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                            sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                            sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                            w++;
                        }

                        // increment for the extra column at the end
                        w += T_PAD;

                        integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                        u++;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            REALTYPE sumOverID1 = 0.0;
            REALTYPE sumOverID2 = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                sumOverID1 += freqs[i] * firstDerivTmp[u];
                sumOverID2 += freqs[i] * secondDerivTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
            outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
            outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }


        outSumLogLikelihoodByPartition[p] = 0.0;
        outSumFirstDerivativeByPartition[p] = 0.0;
        outSumSecondDerivativeByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p]    += outLogLikelihoodsTmp[i]    * gPatternWeights[i];
            outSumFirstDerivativeByPartition[p]  += outFirstDerivativesTmp[i]  * gPatternWeights[i];
            outSumSecondDerivativeByPartition[p] += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }

    }
}